

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  ImGuiWindow *window;
  ImGuiOldColumns *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiID id;
  int iVar5;
  ImGuiOldColumns *pIVar6;
  ImGuiOldColumnData *pIVar7;
  ImGuiOldColumnData *pIVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ImGuiContext *g;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pIVar4 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  window = pIVar4->CurrentWindow;
  id = GetColumnsID(str_id,columns_count);
  pIVar6 = FindOrCreateColumns(window,id);
  pIVar6->Current = 0;
  pIVar6->Count = columns_count;
  pIVar6->Flags = flags;
  (window->DC).CurrentColumns = pIVar6;
  pIVar6->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar6->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar3 = (window->ClipRect).Max;
  (pIVar6->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar6->HostInitialClipRect).Max = IVar3;
  IVar3 = (window->ParentWorkRect).Max;
  (pIVar6->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar6->HostBackupParentWorkRect).Max = IVar3;
  IVar3 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar3;
  fVar1 = (pIVar4->Style).ItemSpacing.x;
  fVar14 = (window->WindowPadding).x;
  fVar16 = fVar1 - fVar14;
  fVar14 = fVar14 * 0.5;
  uVar13 = -(uint)(window->WindowBorderSize <= fVar14);
  fVar15 = (window->WorkRect).Max.x;
  fVar16 = (float)(-(uint)(0.0 <= fVar16) & (uint)fVar16);
  fVar17 = (fVar1 + fVar15) - fVar16;
  fVar15 = (float)(int)(float)(~uVar13 & (uint)window->WindowBorderSize | (uint)fVar14 & uVar13) +
           fVar15;
  if (fVar15 <= fVar17) {
    fVar17 = fVar15;
  }
  fVar16 = ((window->DC).Indent.x - fVar1) + fVar16;
  pIVar6->OffMinX = fVar16;
  fVar17 = fVar17 - (window->Pos).x;
  fVar16 = fVar16 + 1.0;
  uVar13 = -(uint)(fVar16 <= fVar17);
  pIVar6->OffMaxX = (float)(~uVar13 & (uint)fVar16 | (uint)fVar17 & uVar13);
  fVar14 = (window->DC).CursorPos.y;
  pIVar6->LineMaxY = fVar14;
  pIVar6->LineMinY = fVar14;
  iVar12 = (pIVar6->Columns).Size;
  iVar9 = columns_count + 1;
  if (iVar12 == iVar9 || iVar12 == 0) {
    pIVar6->IsFirstFrame = iVar12 == 0;
    if (iVar12 == 0) {
      iVar12 = (pIVar6->Columns).Capacity;
      goto LAB_002332e7;
    }
  }
  else {
    iVar12 = (pIVar6->Columns).Capacity;
    if (iVar12 < 0) {
      iVar12 = 0;
      pIVar7 = (ImGuiOldColumnData *)MemAlloc(0);
      pIVar8 = (pIVar6->Columns).Data;
      if (pIVar8 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar7,pIVar8,(long)(pIVar6->Columns).Size * 0x1c);
        MemFree((pIVar6->Columns).Data);
      }
      (pIVar6->Columns).Data = pIVar7;
      (pIVar6->Columns).Capacity = 0;
    }
    (pIVar6->Columns).Size = 0;
    pIVar6->IsFirstFrame = true;
LAB_002332e7:
    if (iVar12 <= columns_count) {
      pIVar7 = (ImGuiOldColumnData *)MemAlloc((long)iVar9 * 0x1c);
      pIVar8 = (pIVar6->Columns).Data;
      if (pIVar8 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar7,pIVar8,(long)(pIVar6->Columns).Size * 0x1c);
        MemFree((pIVar6->Columns).Data);
      }
      (pIVar6->Columns).Data = pIVar7;
      (pIVar6->Columns).Capacity = iVar9;
    }
    if (columns_count < 0) goto LAB_00233530;
    iVar12 = (pIVar6->Columns).Size;
    iVar10 = 0;
    do {
      if (iVar12 == (pIVar6->Columns).Capacity) {
        if (iVar12 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar12 / 2 + iVar12;
        }
        iVar11 = iVar12 + 1;
        if (iVar12 + 1 < iVar5) {
          iVar11 = iVar5;
        }
        pIVar8 = (ImGuiOldColumnData *)MemAlloc((long)iVar11 * 0x1c);
        pIVar7 = (pIVar6->Columns).Data;
        if (pIVar7 != (ImGuiOldColumnData *)0x0) {
          memcpy(pIVar8,pIVar7,(long)(pIVar6->Columns).Size * 0x1c);
          MemFree((pIVar6->Columns).Data);
        }
        (pIVar6->Columns).Data = pIVar8;
        (pIVar6->Columns).Capacity = iVar11;
        iVar12 = (pIVar6->Columns).Size;
      }
      else {
        pIVar8 = (pIVar6->Columns).Data;
      }
      pIVar8[iVar12].OffsetNorm = (float)iVar10 / (float)columns_count;
      pIVar7 = pIVar8 + iVar12;
      pIVar7->OffsetNormBeforeResize = 0.0;
      pIVar7->Flags = 0;
      (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).x = 0.0;
      (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).y = 0.0;
      pIVar8[iVar12].ClipRect.Max.x = 0.0;
      pIVar8[iVar12].ClipRect.Max.y = 0.0;
      iVar12 = (pIVar6->Columns).Size + 1;
      (pIVar6->Columns).Size = iVar12;
      iVar10 = iVar10 + 1;
    } while (iVar9 != iVar10);
  }
  if (0 < columns_count) {
    iVar12 = 0;
    do {
      pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar2 == (ImGuiOldColumns *)0x0) {
        fVar15 = 0.0;
        fVar14 = 0.0;
      }
      else {
        pIVar8 = (pIVar2->Columns).Data;
        fVar14 = pIVar2->OffMinX;
        fVar17 = pIVar2->OffMaxX - fVar14;
        fVar15 = pIVar8[iVar12].OffsetNorm * fVar17 + fVar14;
        fVar14 = fVar17 * pIVar8[iVar12 + 1].OffsetNorm + fVar14;
      }
      iVar9 = iVar12 + 1;
      pIVar8 = (pIVar6->Columns).Data;
      fVar17 = (window->Pos).x;
      pIVar8[iVar12].ClipRect.Min.x = (float)(int)(fVar15 + fVar17 + 0.5);
      pIVar8[iVar12].ClipRect.Min.y = -3.4028235e+38;
      pIVar8[iVar12].ClipRect.Max.x = (float)(int)(fVar14 + fVar17 + -1.0 + 0.5);
      pIVar8[iVar12].ClipRect.Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar8[iVar12].ClipRect,&window->ClipRect);
      iVar12 = iVar9;
    } while (iVar9 < columns_count);
  }
LAB_00233530:
  if (1 < pIVar6->Count) {
    ImDrawListSplitter::Split(&pIVar6->Splitter,window->DrawList,pIVar6->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar6->Splitter,window->DrawList,1);
    pIVar8 = (((GImGui->CurrentWindow->DC).CurrentColumns)->Columns).Data;
    PushClipRect(&(pIVar8->ClipRect).Min,&(pIVar8->ClipRect).Max,false);
  }
  pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
  fVar15 = 0.0;
  fVar14 = 0.0;
  if (pIVar2 != (ImGuiOldColumns *)0x0) {
    iVar9 = pIVar6->Current;
    iVar12 = iVar9;
    if (iVar9 < 0) {
      iVar12 = pIVar2->Current;
    }
    pIVar8 = (pIVar2->Columns).Data;
    fVar14 = pIVar2->OffMinX;
    fVar17 = pIVar2->OffMaxX - fVar14;
    if (iVar9 < -1) {
      iVar9 = pIVar2->Current;
    }
    else {
      iVar9 = iVar9 + 1;
    }
    fVar15 = pIVar8[iVar12].OffsetNorm * fVar17 + fVar14;
    fVar14 = fVar17 * pIVar8[iVar9].OffsetNorm + fVar14;
  }
  PushItemWidth((fVar14 - fVar15) * 0.65);
  fVar17 = fVar1 - (window->WindowPadding).x;
  fVar17 = (float)(-(uint)(0.0 <= fVar17) & (uint)fVar17);
  (window->DC).ColumnsOffset.x = fVar17;
  fVar15 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar15 + fVar17);
  (window->WorkRect).Max.x = (fVar14 + fVar15) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}